

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O3

void __thiscall IlmThread_3_4::Semaphore::~Semaphore(Semaphore *this)

{
  this->_vptr_Semaphore = (_func_int **)&PTR__Semaphore_00108d38;
  sem_destroy((sem_t *)&this->_semaphore);
  return;
}

Assistant:

Semaphore::~Semaphore ()
{
#    ifdef NDEBUG
    ::sem_destroy (&_semaphore);
#    else
    int error = ::sem_destroy (&_semaphore);
    assert (error == 0);
#    endif
}